

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

Promise<void> __thiscall kj::anon_unknown_77::AsyncTee::pull(AsyncTee *this)

{
  Disposer *pDVar1;
  PromiseNode *pPVar2;
  TransformPromiseNodeBase *pTVar3;
  PromiseNode *extraout_RDX;
  Disposer *in_RSI;
  Promise<void> PVar4;
  Own<kj::_::PromiseNode> intermediate;
  Own<kj::_::PromiseNode> local_78;
  Own<kj::_::PromiseNode> local_68;
  Own<kj::_::PromiseNode> local_50;
  Own<kj::_::PromiseNode> local_40;
  Own<kj::_::PromiseNode> local_30;
  
  kj::_::yield();
  pTVar3 = (TransformPromiseNodeBase *)operator_new(0x30);
  kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar3,&local_78,
             kj::_::
             TransformPromiseNode<kj::Promise<void>,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++:1568:22),_kj::_::PropagateException>
             ::anon_class_8_1_8991fb9c_for_func::operator());
  (pTVar3->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0067a898;
  pTVar3[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)in_RSI;
  intermediate.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<void>,kj::_::Void,kj::(anonymous_namespace)::AsyncTee::pull()::{lambda()#1},kj::_::PropagateException>>
        ::instance;
  intermediate.ptr = (PromiseNode *)pTVar3;
  kj::_::maybeChain<void>(&local_68,(Promise<void> *)&intermediate);
  pPVar2 = local_68.ptr;
  pDVar1 = local_68.disposer;
  local_30.disposer = local_68.disposer;
  local_68.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode>::dispose(&local_68);
  local_50.disposer = pDVar1;
  local_50.ptr = pPVar2;
  local_30.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode>::dispose(&local_30);
  Own<kj::_::PromiseNode>::dispose(&intermediate);
  Own<kj::_::PromiseNode>::dispose(&local_78);
  pTVar3 = (TransformPromiseNodeBase *)operator_new(0x30);
  kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar3,&local_50,
             kj::_::
             TransformPromiseNode<kj::Promise<void>,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++:1583:13),_kj::_::PropagateException>
             ::anon_class_8_1_8991fb9c_for_func::operator());
  (pTVar3->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0067a920;
  pTVar3[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)in_RSI;
  intermediate.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<void>,kj::_::Void,kj::(anonymous_namespace)::AsyncTee::pull()::{lambda()#2},kj::_::PropagateException>>
        ::instance;
  intermediate.ptr = (PromiseNode *)pTVar3;
  kj::_::maybeChain<void>(&local_68,(Promise<void> *)&intermediate);
  pPVar2 = local_68.ptr;
  pDVar1 = local_68.disposer;
  local_30.disposer = local_68.disposer;
  local_68.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode>::dispose(&local_68);
  local_40.disposer = pDVar1;
  local_40.ptr = pPVar2;
  local_30.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode>::dispose(&local_30);
  Own<kj::_::PromiseNode>::dispose(&intermediate);
  pTVar3 = (TransformPromiseNodeBase *)operator_new(0x30);
  kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar3,&local_40,kj::_::IdentityFunc<void>::operator());
  (pTVar3->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0067aa30;
  pTVar3[1].dependency.disposer = in_RSI;
  intermediate.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::_::IdentityFunc<void>,kj::(anonymous_namespace)::AsyncTee::pull()::{lambda(kj::Exception&&)#1}>>
        ::instance;
  local_30.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::_::IdentityFunc<void>,kj::(anonymous_namespace)::AsyncTee::pull()::{lambda(kj::Exception&&)#1}>>
        ::instance;
  intermediate.ptr = (PromiseNode *)0x0;
  local_78.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::_::IdentityFunc<void>,kj::(anonymous_namespace)::AsyncTee::pull()::{lambda(kj::Exception&&)#1}>>
        ::instance;
  local_30.ptr = (PromiseNode *)0x0;
  local_78.ptr = (PromiseNode *)pTVar3;
  Own<kj::_::PromiseNode>::dispose(&local_30);
  Own<kj::_::PromiseNode>::dispose(&intermediate);
  kj::_::spark<kj::_::Void>((_ *)&local_68,&local_78);
  (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)local_68.disposer;
  *(PromiseNode **)&(this->super_Refcounted).refcount = local_68.ptr;
  local_68.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode>::dispose(&local_68);
  Own<kj::_::PromiseNode>::dispose(&local_78);
  Own<kj::_::PromiseNode>::dispose(&local_40);
  Own<kj::_::PromiseNode>::dispose(&local_50);
  PVar4.super_PromiseBase.node.ptr = extraout_RDX;
  PVar4.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar4.super_PromiseBase.node;
}

Assistant:

Promise<void> pull() {
    // Use evalLater() so that two pump sinks added on the same turn of the event loop will not
    // cause buffering.
    return evalLater([this] {
      // Attempt to fill any sinks that exist.

      Vector<Promise<void>> promises;

      for (auto& state: branches) {
        KJ_IF_MAYBE(s, state) {
          KJ_IF_MAYBE(sink, s->sink) {
            promises.add(sink->fill(s->buffer, stoppage));
          }
        }
      }

      // Respect the greatest of the sinks' backpressures.
      return joinPromises(promises.releaseAsArray());
    }).then([this]() -> Promise<void> {
      // Check to see whether we need to perform an inner read.

      auto need = analyzeSinks();

      if (need == nullptr) {
        // No more sinks, stop pulling.
        pulling = false;
        return READY_NOW;
      }

      if (stoppage != nullptr) {
        // We're eof or errored, don't read, but loop so we can fill the sink(s).
        return pull();
      }

      auto& n = KJ_ASSERT_NONNULL(need);

      KJ_ASSERT(n.minBytes > 0);

      // We must perform an inner read.

      // We'd prefer not to explode our buffer, if that's cool. We cap `maxBytes` to the buffer size
      // limit or our builtin MAX_BLOCK_SIZE, whichever is smaller. But, we make sure `maxBytes` is
      // still >= `minBytes`.
      n.maxBytes = kj::min(n.maxBytes, MAX_BLOCK_SIZE);
      n.maxBytes = kj::min(n.maxBytes, bufferSizeLimit);
      n.maxBytes = kj::max(n.minBytes, n.maxBytes);
      for (auto& state: branches) {
        KJ_IF_MAYBE(s, state) {
          // TODO(perf): buffer.size() is O(n) where n = # of individual heap-allocated byte arrays.
          if (s->buffer.size() + n.maxBytes > bufferSizeLimit) {
            stoppage = Stoppage(KJ_EXCEPTION(FAILED, "tee buffer size limit exceeded"));
            return pull();
          }
        }
      }
      auto heapBuffer = heapArray<byte>(n.maxBytes);

      // gcc 4.9 quirk: If I don't hoist this into a separate variable and instead call
      //
      //   inner->tryRead(heapBuffer.begin(), n.minBytes, heapBuffer.size())
      //
      // `heapBuffer` seems to get moved into the lambda capture before the arguments to `tryRead()`
      // are evaluated, meaning `inner` sees a nullptr destination. Bizarrely, `inner` sees the
      // correct value for `heapBuffer.size()`... I dunno, man.
      auto destination = heapBuffer.begin();

      try {
        return inner->tryRead(destination, n.minBytes, n.maxBytes)
            .then([this, heapBuffer = mv(heapBuffer), minBytes = n.minBytes](size_t amount) mutable
                -> Promise<void> {
          length = length.map([amount](uint64_t n) {
            KJ_ASSERT(n >= amount);
            return n - amount;
          });

          if (amount < heapBuffer.size()) {
            heapBuffer = heapBuffer.slice(0, amount).attach(mv(heapBuffer));
          }

          KJ_ASSERT(stoppage == nullptr);
          Maybe<ArrayPtr<byte>> bufferPtr = nullptr;
          for (auto& state: branches) {
            KJ_IF_MAYBE(s, state) {
              // Prefer to move the buffer into the receiving branch's deque, rather than memcpy.
              //
              // TODO(perf): For the 2-branch case, this is fine, since the majority of the time
              //   only one buffer will be in use. If we generalize to the n-branch case, this would
              //   become memcpy-heavy.
              KJ_IF_MAYBE(ptr, bufferPtr) {
                s->buffer.produce(heapArray(*ptr));
              } else {
                bufferPtr = ArrayPtr<byte>(heapBuffer);
                s->buffer.produce(mv(heapBuffer));
              }
            }
          }

          if (amount < minBytes) {
            // Short read, EOF.
            stoppage = Stoppage(Eof());
          }

          return pull();
        }, [this](Exception&& exception) {
          // Exception from the inner tryRead(). Propagate.
          stoppage = Stoppage(mv(exception));
          return pull();
        });
      }